

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O0

int pcx_parse_args(int i,int nb,int *a,int *b,int *c,int *d,int size)

{
  uint local_48;
  uint local_44;
  int h;
  int w;
  int y;
  int x;
  int *d_local;
  int *c_local;
  int *b_local;
  int *a_local;
  int nb_local;
  int i_local;
  
  w = 0;
  h = 0;
  if (nb == 0) {
    local_44 = pcx_w / size;
    local_48 = pcx_h / size;
  }
  else if (nb == 2) {
    local_44 = pcx_arg[i];
    local_48 = pcx_arg[i + 1];
  }
  else {
    w = pcx_arg[i];
    h = pcx_arg[i + 1];
    local_44 = pcx_arg[i + 2];
    local_48 = pcx_arg[i + 3];
  }
  if ((pcx_w < (int)(w + local_44 * size)) || (pcx_h < (int)(h + local_48 * size))) {
    error("Coordinates out of range!");
    nb_local = 0;
  }
  else {
    *a = w;
    *b = h;
    *c = local_44;
    *d = local_48;
    nb_local = 1;
  }
  return nb_local;
}

Assistant:

int
pcx_parse_args(int i, int nb, int *a, int *b, int *c, int *d, int size)
{
	int x, y, w, h;

	x = 0;
	y = 0;

	/* get coordinates */
	if (nb == 0) {			/* no arg */
		w = (pcx_w / size);
		h = (pcx_h / size);
	}
	else if (nb == 2) {		/* 2 args */
		w = pcx_arg[i];
		h = pcx_arg[i+1];
	}
	else {					/* 4 args */
		x = pcx_arg[i];
		y = pcx_arg[i+1];
		w = pcx_arg[i+2];
		h = pcx_arg[i+3];
	}

	/* check */
	if (((x + w * size) > pcx_w) || ((y + h * size) > pcx_h)) {
		error("Coordinates out of range!");
		return (0);
	}

	/* write back the value */
	*a = x;
	*b = y;
	*c = w;
	*d = h;

	/* ok */
	return (1);
}